

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandlerCSV.cpp
# Opt level: O2

void __thiscall
DataHandlerCSV::DataHandlerCSV(DataHandlerCSV *this,string *pathToFiles,char delimiter)

{
  string *__lhs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint_fast16_t uVar4;
  bool bVar5;
  istream *piVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong uVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  Database *ppTVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint_fast16_t attributeID;
  long local_428;
  string line;
  string tableName;
  string attrName;
  stringstream ssLine;
  ostream local_3b0 [376];
  ifstream input;
  byte abStack_218 [488];
  
  DataHandler::DataHandler(&this->super_DataHandler,pathToFiles,delimiter);
  (this->super_DataHandler)._vptr_DataHandler = (_func_int **)&PTR__DataHandlerCSV_00152ac8;
  __lhs = &(this->super_DataHandler)._pathToFiles;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,__lhs,
                 &SCHEMA_CONF_abi_cxx11_);
  std::ifstream::ifstream(&input,(string *)&ssLine,_S_in);
  std::__cxx11::string::~string((string *)&ssLine);
  if ((abStack_218[*(long *)(_input + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&ssLine);
    lVar14 = 0;
    uVar17 = 0;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&line);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      if (*line._M_dataplus._M_p != '#') {
        bVar5 = std::operator==(&line,"");
        if (!bVar5) {
          uVar17 = uVar17 + 1;
          lVar14 = lVar14 + 0x20;
        }
      }
    }
    dfdb::params::NUM_OF_TABLES = uVar17;
    puVar7 = (ulong *)operator_new__(-(ulong)(uVar17 >> 0x3b != 0) | uVar17 << 5 | 8);
    *puVar7 = uVar17;
    if (uVar17 != 0) {
      puVar8 = puVar7 + 3;
      do {
        puVar8[-2] = (ulong)puVar8;
        puVar8[-1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar8 = puVar8 + 4;
        lVar14 = lVar14 + -0x20;
      } while (lVar14 != 0);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar17;
    uVar9 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar15 = uVar9 + 8;
    if (0xfffffffffffffff7 < uVar9) {
      uVar15 = 0xffffffffffffffff;
    }
    (this->super_DataHandler)._tableNames = (string *)(puVar7 + 1);
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
      uVar15 = 0xffffffffffffffff;
    }
    puVar7 = (ulong *)operator_new__(uVar15);
    *puVar7 = uVar17;
    if (uVar17 != 0) {
      memset((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar7 + 1),0,
             ((uVar9 - 0x18) - (uVar9 - 0x18) % 0x18) + 0x18);
    }
    (this->super_DataHandler)._attrIDs =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar7 + 1);
    std::ios::clear((int)(istream *)&input + (int)*(undefined8 *)(_input + -0x18));
    std::istream::seekg((long)&input,_S_beg);
    attributeID = 0;
    this_00 = &(this->super_DataHandler)._namesMapping;
    local_428 = 0;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&line);
      uVar17 = dfdb::params::NUM_OF_WORKERS;
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      if (*line._M_dataplus._M_p != '#') {
        bVar5 = std::operator==(&line,"");
        if (!bVar5) {
          std::operator<<(local_3b0,(string *)&line);
          tableName._M_string_length = 0;
          tableName.field_2._M_local_buf[0] = '\0';
          tableName._M_dataplus._M_p = (pointer)&tableName.field_2;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&ssLine,(string *)&tableName,':');
          lVar14 = local_428;
          std::__cxx11::string::_M_assign
                    ((string *)((this->super_DataHandler)._tableNames + local_428));
          attrName._M_dataplus._M_p = (pointer)&attrName.field_2;
          attrName._M_string_length = 0;
          attrName.field_2._M_local_buf[0] = '\0';
          while( true ) {
            piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&ssLine,(string *)&attrName,',');
            if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
            sVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::count(&this_00->_M_h,&attrName);
            uVar4 = attributeID;
            if (sVar10 == 0) {
              pmVar11 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)this_00,&attrName);
              *pmVar11 = uVar4;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((this->super_DataHandler)._attrIDs + lVar14,&attributeID);
              attributeID = attributeID + 1;
            }
            else {
              pvVar1 = (this->super_DataHandler)._attrIDs;
              pmVar11 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)this_00,&attrName);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (pvVar1 + lVar14,pmVar11);
            }
          }
          std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
          local_428 = local_428 + 1;
          std::__cxx11::string::~string((string *)&attrName);
          std::__cxx11::string::~string((string *)&tableName);
        }
      }
    }
    ppTVar12 = (Database *)
               operator_new__(-(ulong)(dfdb::params::NUM_OF_WORKERS >> 0x3d != 0) |
                              dfdb::params::NUM_OF_WORKERS * 8);
    (this->super_DataHandler)._receivedDataToProcess = ppTVar12;
    uVar15 = dfdb::params::NUM_OF_TABLES;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dfdb::params::NUM_OF_TABLES;
    uVar13 = SUB168(auVar3 * ZEXT816(0x18),0);
    uVar9 = uVar13 + 8;
    if (0xfffffffffffffff7 < uVar13) {
      uVar9 = 0xffffffffffffffff;
    }
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar16 = dfdb::params::NUM_OF_TABLES * 0x18 - 0x18;
    for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
      puVar7 = (ulong *)operator_new__(uVar9);
      *puVar7 = uVar15;
      if (uVar15 != 0) {
        memset((Database)(puVar7 + 1),0,(uVar16 - uVar16 % 0x18) + 0x18);
      }
      (this->super_DataHandler)._receivedDataToProcess[uVar13] = (Database)(puVar7 + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ssLine);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&input);
    return;
  }
  std::operator+(&line,__lhs,&SCHEMA_CONF_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,&line,
                 " does is not exist. \n");
  std::operator<<((ostream *)&std::cerr,(string *)&ssLine);
  std::__cxx11::string::~string((string *)&ssLine);
  std::__cxx11::string::~string((string *)&line);
  exit(1);
}

Assistant:

DataHandlerCSV::DataHandlerCSV(const string& pathToFiles, const char delimiter) :
		DataHandler(pathToFiles, delimiter)
{
	/* Load the database schema file into an input stream. */
	ifstream input(_pathToFiles + SCHEMA_CONF);
    
    if (!input)
    {
        ERROR (_pathToFiles + SCHEMA_CONF + " does is not exist. \n");
        exit(1);
    }
    
	/* String and associated stream to receive lines from the file. */
	string line;
	stringstream ssLine;

	size_t numOfTables = 0;

	/* Count the number of tables in the database. */
	while (getline(input, line))
	{
		if (line[0] == COMMENT_CHAR || line == "")
			continue;
		++numOfTables;
	}

	/* Check consistency between compile time flag and runtime value issued from configuration file. */
#ifdef TABLES
	if(TABLES != numOfTables)
	{
		ERROR("Value of compiler flag -DTABLES and number of tables specified in schema.conf inconsistent. Aborting.\n")
		exit(1);
	}
	/* Assign value to extern variable in GlobalParams.hpp. */
#else
	NUM_OF_TABLES = numOfTables;
#endif

	/* Initialise arrays; each element will correspond to one database table. */
	_tableNames = new string[NUM_OF_TABLES];
	_attrIDs = new vector<uint_fast16_t> [NUM_OF_TABLES];

	/* Reset input stream to beginning of file. */
	input.clear();
	input.seekg(0, ios::beg);

	/* Variable defining the ID of each attribute. */
	uint_fast16_t attributeID = 0;

	size_t table = 0;
	/* Scan through the input stream line by line. */
	while (getline(input, line))
	{
		if (line[0] == COMMENT_CHAR || line == "")
			continue;

		ssLine << line;

		string tableName;
		/* Extract the name of the table in the current line. */
		getline(ssLine, tableName, TABLE_NAME_CHAR);
		_tableNames[table] = tableName;

		string attrName;
		/* Scan through the attributes in the current line. */
		while (getline(ssLine, attrName, ATTRIBUTE_SEPARATOR_CHAR))
		{
			/* Attribute encountered for the first time in the schema: give it a new ID. */
			if (_namesMapping.count(attrName) == 0)
			{
				_namesMapping[attrName] = attributeID;
				_attrIDs[table].push_back(attributeID);
				++attributeID;
			}
			/* Attribute already encountered: just add its ID to the vector of IDs for the current table. */
			else
			{
				_attrIDs[table].push_back(_namesMapping[attrName]);
			}
		}
		++table;
		/* Clear string stream. */
		ssLine.clear();
	}
	assert(
			table == NUM_OF_TABLES
					&& "The same number of lines must be processed during the first and the second pass over the schema file.");

	/* Initialise array; each element will correspond to one orker in the network. */
	_receivedDataToProcess = new Database[NUM_OF_WORKERS];
	for (size_t worker = 0; worker < NUM_OF_WORKERS; ++worker)
	{
		_receivedDataToProcess[worker] = new Table[NUM_OF_TABLES];
	}
}